

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void __thiscall ImGuiStackSizes::SetToCurrentState(ImGuiStackSizes *this)

{
  ImGuiContext *pIVar1;
  
  pIVar1 = GImGui;
  this->SizeOfIDStack = (short)(GImGui->CurrentWindow->IDStack).Size;
  this->SizeOfColorStack = (short)(pIVar1->ColorStack).Size;
  this->SizeOfStyleVarStack = (short)(pIVar1->StyleVarStack).Size;
  this->SizeOfFontStack = (short)(pIVar1->FontStack).Size;
  this->SizeOfFocusScopeStack = (short)(pIVar1->FocusScopeStack).Size;
  this->SizeOfGroupStack = (short)(pIVar1->GroupStack).Size;
  this->SizeOfBeginPopupStack = (short)(pIVar1->BeginPopupStack).Size;
  return;
}

Assistant:

void ImGuiStackSizes::SetToCurrentState()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    SizeOfIDStack = (short)window->IDStack.Size;
    SizeOfColorStack = (short)g.ColorStack.Size;
    SizeOfStyleVarStack = (short)g.StyleVarStack.Size;
    SizeOfFontStack = (short)g.FontStack.Size;
    SizeOfFocusScopeStack = (short)g.FocusScopeStack.Size;
    SizeOfGroupStack = (short)g.GroupStack.Size;
    SizeOfBeginPopupStack = (short)g.BeginPopupStack.Size;
}